

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funnelsort.cpp
# Opt level: O0

void funnelsort<32u,buffer_layout_bfs>(uchar **strings,size_t n,uchar **tmp)

{
  long lVar1;
  size_t sVar2;
  int iVar3;
  ostream *poVar4;
  reference pvVar5;
  uchar **ppuVar6;
  pointer buffer;
  reference pvVar7;
  value_type local_38b0;
  undefined1 local_38a8 [8];
  array<unsigned_long,_32UL> buffer_count;
  array<unsigned_char_*,_1692UL> buffers;
  uint i_1;
  uint i;
  array<Stream,_32UL> streams;
  size_t splitter;
  uchar **tmp_local;
  size_t n_local;
  uchar **strings_local;
  uchar **local_98;
  uchar **begin_1;
  size_t num_1;
  uchar **local_80;
  uchar **begin;
  value_type local_70;
  size_t num;
  uchar **r;
  uchar **l;
  size_t rcount;
  size_t lcount;
  fill<32U,_2U,_buffer_layout_bfs> local_31;
  DI local_30;
  DI __d;
  uchar **local_18;
  
  poVar4 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,"funnelsort");
  poVar4 = std::operator<<(poVar4,"(), n=");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,n);
  std::operator<<(poVar4,"\n");
  if (n < 0x20) {
    insertion_sort(strings,(int)n,0);
  }
  else {
    streams._M_elems[0x1f].n = n >> 5;
    pvVar5 = std::array<Stream,_32UL>::operator[]((array<Stream,_32UL> *)&i_1,0);
    sVar2 = streams._M_elems[0x1f].n;
    pvVar5->stream = strings;
    pvVar5 = std::array<Stream,_32UL>::operator[]((array<Stream,_32UL> *)&i_1,0);
    pvVar5->n = sVar2;
    for (buffers._M_elems[0x69b]._4_4_ = 1; buffers._M_elems[0x69b]._4_4_ < 0x1f;
        buffers._M_elems[0x69b]._4_4_ = buffers._M_elems[0x69b]._4_4_ + 1) {
      pvVar5 = std::array<Stream,_32UL>::operator[]
                         ((array<Stream,_32UL> *)&i_1,(ulong)(buffers._M_elems[0x69b]._4_4_ - 1));
      ppuVar6 = pvVar5->stream + streams._M_elems[0x1f].n;
      pvVar5 = std::array<Stream,_32UL>::operator[]
                         ((array<Stream,_32UL> *)&i_1,(ulong)buffers._M_elems[0x69b]._4_4_);
      sVar2 = streams._M_elems[0x1f].n;
      pvVar5->stream = ppuVar6;
      pvVar5 = std::array<Stream,_32UL>::operator[]
                         ((array<Stream,_32UL> *)&i_1,(ulong)buffers._M_elems[0x69b]._4_4_);
      pvVar5->n = sVar2;
    }
    pvVar5 = std::array<Stream,_32UL>::operator[]((array<Stream,_32UL> *)&i_1,0x1e);
    ppuVar6 = pvVar5->stream + streams._M_elems[0x1f].n;
    pvVar5 = std::array<Stream,_32UL>::operator[]((array<Stream,_32UL> *)&i_1,0x1f);
    pvVar5->stream = ppuVar6;
    lVar1 = streams._M_elems[0x1f].n * -0x1f;
    pvVar5 = std::array<Stream,_32UL>::operator[]((array<Stream,_32UL> *)&i_1,0x1f);
    pvVar5->n = n + lVar1;
    for (buffers._M_elems[0x69b]._0_4_ = 0; (uint)buffers._M_elems[0x69b] < 0x20;
        buffers._M_elems[0x69b]._0_4_ = (uint)buffers._M_elems[0x69b] + 1) {
      pvVar5 = std::array<Stream,_32UL>::operator[]
                         ((array<Stream,_32UL> *)&i_1,(ulong)(uint)buffers._M_elems[0x69b]);
      ppuVar6 = pvVar5->stream;
      pvVar5 = std::array<Stream,_32UL>::operator[]
                         ((array<Stream,_32UL> *)&i_1,(ulong)(uint)buffers._M_elems[0x69b]);
      funnelsort<8u,buffer_layout_bfs>(ppuVar6,pvVar5->n,tmp);
      pvVar5 = std::array<Stream,_32UL>::operator[]
                         ((array<Stream,_32UL> *)&i_1,(ulong)(uint)buffers._M_elems[0x69b]);
      ppuVar6 = pvVar5->stream;
      pvVar5 = std::array<Stream,_32UL>::operator[]
                         ((array<Stream,_32UL> *)&i_1,(ulong)(uint)buffers._M_elems[0x69b]);
      check_input(ppuVar6,pvVar5->n);
    }
    local_38b0 = 0;
    std::array<unsigned_long,_32UL>::fill((array<unsigned_long,_32UL> *)local_38a8,&local_38b0);
    buffer = std::array<unsigned_char_*,_1692UL>::data
                       ((array<unsigned_char_*,_1692UL> *)(buffer_count._M_elems + 0x1f));
    __d.i = (string *)local_38a8;
    poVar4 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
    poVar4 = std::operator<<(poVar4,"fill_root");
    std::operator<<(poVar4,", root\n");
    fill_root<32u,buffer_layout_bfs>(std::array<Stream,32u>&,unsigned_char**,unsigned_char**,std::
    array<unsigned_long,32u>&)::DI::DI(std::__cxx11::string__
              (&local_30,(string *)__debug_indent_str_abi_cxx11_);
    local_18 = tmp;
LAB_0013d03e:
    pvVar7 = std::array<unsigned_long,_32UL>::operator[]((array<unsigned_long,_32UL> *)__d.i,2);
    if (*pvVar7 == 0) {
      fill<32U,_2U,_buffer_layout_bfs>::operator()
                (&local_31,(array<Stream,_32UL> *)&i_1,buffer,(array<unsigned_long,_32UL> *)__d.i);
      pvVar7 = std::array<unsigned_long,_32UL>::operator[]((array<unsigned_long,_32UL> *)__d.i,2);
      if (*pvVar7 != 0) goto LAB_0013d0bc;
      poVar4 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
      std::operator<<(poVar4,"left stream drained\n");
      pvVar7 = std::array<unsigned_long,_32UL>::operator[]((array<unsigned_long,_32UL> *)__d.i,2);
      if (*pvVar7 != 0) {
        __assert_fail("buffer_count[2] == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                      ,0x238,
                      "void fill_root(std::array<Stream, K> &__restrict, unsigned char **__restrict, unsigned char **__restrict, std::array<size_t, K> &__restrict) [K = 32U, BufferLayout = buffer_layout_bfs]"
                     );
      }
      pvVar7 = std::array<unsigned_long,_32UL>::operator[]((array<unsigned_long,_32UL> *)__d.i,3);
      if (*pvVar7 == 0) {
        __assert_fail("buffer_count[3] != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                      ,0x239,
                      "void fill_root(std::array<Stream, K> &__restrict, unsigned char **__restrict, unsigned char **__restrict, std::array<size_t, K> &__restrict) [K = 32U, BufferLayout = buffer_layout_bfs]"
                     );
      }
      while( true ) {
        pvVar7 = std::array<unsigned_long,_32UL>::operator[]((array<unsigned_long,_32UL> *)__d.i,3);
        local_70 = *pvVar7;
        if (local_70 == 0) break;
        local_80 = buffer + (0x10 - local_70);
        std::copy<unsigned_char**,unsigned_char**>(local_80,local_80 + local_70,local_18);
        local_18 = local_18 + local_70;
        pvVar7 = std::array<unsigned_long,_32UL>::operator[]((array<unsigned_long,_32UL> *)__d.i,3);
        *pvVar7 = 0;
        fill<32U,_3U,_buffer_layout_bfs>::operator()
                  ((fill<32U,_3U,_buffer_layout_bfs> *)((long)&num_1 + 7),
                   (array<Stream,_32UL> *)&i_1,buffer,(array<unsigned_long,_32UL> *)__d.i);
      }
      local_70 = 0;
      goto LAB_0013d4de;
    }
LAB_0013d0bc:
    pvVar7 = std::array<unsigned_long,_32UL>::operator[]((array<unsigned_long,_32UL> *)__d.i,3);
    if (*pvVar7 != 0) {
LAB_0013d11c:
      pvVar7 = std::array<unsigned_long,_32UL>::operator[]((array<unsigned_long,_32UL> *)__d.i,2);
      rcount = *pvVar7;
      pvVar7 = std::array<unsigned_long,_32UL>::operator[]((array<unsigned_long,_32UL> *)__d.i,3);
      l = (uchar **)*pvVar7;
      r = buffer + (8 - rcount);
      num = (size_t)(buffer + (0x10 - (long)l));
      poVar4 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
      poVar4 = std::operator<<(poVar4,"L:\'");
      poVar4 = std::operator<<(poVar4,*r);
      poVar4 = std::operator<<(poVar4,"\', R:\'");
      poVar4 = std::operator<<(poVar4,*(uchar **)num);
      std::operator<<(poVar4,"\'\n");
      iVar3 = cmp(*r,*(void **)num);
      if (iVar3 < 1) {
        *local_18 = *r;
        pvVar7 = std::array<unsigned_long,_32UL>::operator[]((array<unsigned_long,_32UL> *)__d.i,2);
        *pvVar7 = *pvVar7 - 1;
      }
      else {
        *local_18 = *(uchar **)num;
        pvVar7 = std::array<unsigned_long,_32UL>::operator[]((array<unsigned_long,_32UL> *)__d.i,3);
        *pvVar7 = *pvVar7 - 1;
      }
      local_18 = local_18 + 1;
      goto LAB_0013d03e;
    }
    fill<32U,_3U,_buffer_layout_bfs>::operator()
              ((fill<32U,_3U,_buffer_layout_bfs> *)((long)&lcount + 3),(array<Stream,_32UL> *)&i_1,
               buffer,(array<unsigned_long,_32UL> *)__d.i);
    pvVar7 = std::array<unsigned_long,_32UL>::operator[]((array<unsigned_long,_32UL> *)__d.i,3);
    if (*pvVar7 != 0) goto LAB_0013d11c;
    poVar4 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
    std::operator<<(poVar4,"right stream drained\n");
    pvVar7 = std::array<unsigned_long,_32UL>::operator[]((array<unsigned_long,_32UL> *)__d.i,2);
    if (*pvVar7 == 0) {
      __assert_fail("buffer_count[2] != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                    ,0x247,
                    "void fill_root(std::array<Stream, K> &__restrict, unsigned char **__restrict, unsigned char **__restrict, std::array<size_t, K> &__restrict) [K = 32U, BufferLayout = buffer_layout_bfs]"
                   );
    }
    pvVar7 = std::array<unsigned_long,_32UL>::operator[]((array<unsigned_long,_32UL> *)__d.i,3);
    if (*pvVar7 != 0) {
      __assert_fail("buffer_count[3] == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                    ,0x248,
                    "void fill_root(std::array<Stream, K> &__restrict, unsigned char **__restrict, unsigned char **__restrict, std::array<size_t, K> &__restrict) [K = 32U, BufferLayout = buffer_layout_bfs]"
                   );
    }
    while( true ) {
      pvVar7 = std::array<unsigned_long,_32UL>::operator[]((array<unsigned_long,_32UL> *)__d.i,2);
      begin_1 = (uchar **)*pvVar7;
      if (begin_1 == (uchar **)0x0) break;
      local_98 = buffer + (8 - (long)begin_1);
      std::copy<unsigned_char**,unsigned_char**>(local_98,local_98 + (long)begin_1,local_18);
      local_18 = local_18 + (long)begin_1;
      pvVar7 = std::array<unsigned_long,_32UL>::operator[]((array<unsigned_long,_32UL> *)__d.i,2);
      *pvVar7 = 0;
      fill<32U,_2U,_buffer_layout_bfs>::operator()
                ((fill<32U,_2U,_buffer_layout_bfs> *)((long)&strings_local + 7),
                 (array<Stream,_32UL> *)&i_1,buffer,(array<unsigned_long,_32UL> *)__d.i);
    }
    begin_1 = (uchar **)0x0;
LAB_0013d4de:
    begin._4_4_ = 1;
    anon_func::DI::~DI(&local_30);
    memcpy(strings,tmp,n << 3);
    check_input(strings,n);
  }
  return;
}

Assistant:

static void
funnelsort(unsigned char** strings, size_t n, unsigned char** restrict tmp)
{
	debug() << __func__ << "(), n=" << n << "\n";
	if (n < 32) {
		insertion_sort(strings, n, 0);
		return;
	}
	size_t splitter = n/K;
	std::array<Stream, K> streams;
	streams[0].stream = strings;
	streams[0].n      = splitter;
	for (unsigned i=1; i < K-1; ++i) {
		streams[i].stream = streams[i-1].stream + splitter;
		streams[i].n = splitter;
	}
	streams[K-1].stream = streams[K-2].stream + splitter;
	streams[K-1].n      = n - (K-1)*splitter;
	for (unsigned i=0; i < K; ++i) {
		funnelsort<(K>16?K/4:K/2),BufferLayout>(streams[i].stream,
		                                        streams[i].n, tmp);
		check_input(streams[i].stream, streams[i].n);
	}
	std::array<unsigned char*, buffer_total_size<K>::value> buffers;
	std::array<size_t, K> buffer_count;
	buffer_count.fill(0);
	fill_root<K,BufferLayout>(streams,tmp,buffers.data(),buffer_count);
	(void) memcpy(strings, tmp, n*sizeof(unsigned char*));
	check_input(strings, n);
}